

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int handle_certificate_verify(ptls_t *tls,ptls_iovec_t message,char *context_string)

{
  ushort uVar1;
  _func_int_void_ptr_uint16_t_ptls_iovec_t_ptls_iovec_t *p_Var2;
  ptls_key_schedule_t *ppVar3;
  int iVar4;
  size_t sVar5;
  ushort uVar6;
  ulong uVar7;
  uint8_t *puVar8;
  ptls_hash_context_t **pppVar9;
  ptls_iovec_t pVar10;
  ptls_iovec_t pVar11;
  uint8_t signdata [226];
  uint8_t auStack_118 [232];
  
  uVar7 = message.len;
  puVar8 = message.base;
  iVar4 = 0x32;
  if (((5 < (long)uVar7) && ((uVar7 & 0x7ffffffffffffffe) != 6)) &&
     (uVar6 = *(ushort *)(puVar8 + 6) << 8 | *(ushort *)(puVar8 + 6) >> 8,
     puVar8 + (ulong)uVar6 + 8 == puVar8 + uVar7 && (ulong)uVar6 <= uVar7 - 8)) {
    uVar1 = *(ushort *)(puVar8 + 4);
    sVar5 = build_certificate_verify_signdata(auStack_118,tls->key_schedule,context_string);
    p_Var2 = (tls->certificate_verify).cb;
    if (p_Var2 == (_func_int_void_ptr_uint16_t_ptls_iovec_t_ptls_iovec_t *)0x0) {
      iVar4 = 0;
    }
    else {
      pVar10.len._0_2_ = uVar6;
      pVar10.base = puVar8 + 8;
      pVar10.len._2_6_ = 0;
      pVar11.len = sVar5;
      pVar11.base = auStack_118;
      iVar4 = (*p_Var2)((tls->certificate_verify).verify_ctx,uVar1 << 8 | uVar1 >> 8,pVar11,pVar10);
    }
    (*ptls_clear_memory)(auStack_118,sVar5);
    (tls->certificate_verify).cb = (_func_int_void_ptr_uint16_t_ptls_iovec_t_ptls_iovec_t *)0x0;
    if (iVar4 == 0) {
      ppVar3 = tls->key_schedule;
      if (ppVar3->num_hashes == 0) {
        iVar4 = 0;
      }
      else {
        pppVar9 = &ppVar3->hashes[0].ctx;
        iVar4 = 0;
        sVar5 = 0;
        do {
          (*(*pppVar9)->update)(*pppVar9,puVar8,uVar7);
          sVar5 = sVar5 + 1;
          pppVar9 = pppVar9 + 2;
        } while (sVar5 != ppVar3->num_hashes);
      }
    }
  }
  return iVar4;
}

Assistant:

static int handle_certificate_verify(ptls_t *tls, ptls_iovec_t message, const char *context_string)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *const end = message.base + message.len;
    uint16_t algo;
    ptls_iovec_t signature;
    uint8_t signdata[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
    size_t signdata_size;
    int ret;

    /* decode */
    if ((ret = ptls_decode16(&algo, &src, end)) != 0)
        goto Exit;
    ptls_decode_block(src, end, 2, {
        signature = ptls_iovec_init(src, end - src);
        src = end;
    });

    signdata_size = build_certificate_verify_signdata(signdata, tls->key_schedule, context_string);
    if (tls->certificate_verify.cb != NULL) {
        ret = tls->certificate_verify.cb(tls->certificate_verify.verify_ctx, algo, ptls_iovec_init(signdata, signdata_size),
                                         signature);
    } else {
        ret = 0;
    }
    ptls_clear_memory(signdata, signdata_size);
    tls->certificate_verify.cb = NULL;
    if (ret != 0) {
        goto Exit;
    }

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);

Exit:
    return ret;
}